

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O2

int writeMPS_dense_cpp(char *filename,int *numRow_p,int *numCol_p,int *objSense_p,
                      double *objOffset_p,double **A_rw_p,double **rhs_p,double **cost_p,
                      double **lb_p,double **ub_p,int **integerColumn_p)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  size_type __new_size;
  uint uVar7;
  int objSense;
  int numCol;
  int numRow;
  vector<double,_std::allocator<double>_> ub;
  vector<double,_std::allocator<double>_> lb;
  vector<double,_std::allocator<double>_> cost;
  vector<double,_std::allocator<double>_> rhs;
  vector<int,_std::allocator<int>_> integerColumn;
  double objOffset;
  vector<double,_std::allocator<double>_> A_rw;
  
  A_rw.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  A_rw.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  A_rw.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  integerColumn.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  integerColumn.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  integerColumn.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar2 = *numRow_p;
  uVar3 = *numCol_p;
  uVar7 = *objSense_p;
  dVar1 = *objOffset_p;
  objSense = uVar7;
  numCol = uVar3;
  numRow = uVar2;
  objOffset = dVar1;
  printf("writeMPS_dense_cpp: Model has %d rows and %d columns\n",(ulong)uVar2,(ulong)uVar3);
  printf("writeMPS_dense_cpp: Objective sense is %d; Objective offset is %g\n",SUB84(dVar1,0),
         (ulong)uVar7);
  uVar7 = uVar3 * uVar2;
  std::vector<double,_std::allocator<double>_>::resize(&A_rw,(long)(int)uVar7);
  std::vector<double,_std::allocator<double>_>::resize(&rhs,(long)(int)uVar2);
  __new_size = (size_type)(int)uVar3;
  std::vector<double,_std::allocator<double>_>::resize(&cost,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&lb,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&ub,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&integerColumn,__new_size);
  puts("writeMPS_dense_cpp: Allocated space");
  std::ostream::flush();
  uVar6 = 0;
  uVar5 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    A_rw.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar6] = (*A_rw_p)[uVar6];
  }
  uVar6 = 0;
  uVar5 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [uVar6] = (*rhs_p)[uVar6];
  }
  uVar6 = 0;
  uVar5 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 * 4 != uVar6; uVar6 = uVar6 + 4) {
    *(undefined8 *)
     ((long)cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_start + uVar6 * 2) = *(undefined8 *)((long)*cost_p + uVar6 * 2);
    *(undefined8 *)
     ((long)lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start + uVar6 * 2) = *(undefined8 *)((long)*lb_p + uVar6 * 2);
    *(undefined8 *)
     ((long)ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start + uVar6 * 2) = *(undefined8 *)((long)*ub_p + uVar6 * 2);
    *(undefined4 *)
     ((long)integerColumn.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start + uVar6) =
         *(undefined4 *)((long)*integerColumn_p + uVar6);
  }
  puts("writeMPS_dense_cpp: Copied A, RHS, costs and bounds");
  std::ostream::flush();
  iVar4 = writeMPS_dense(filename,&numRow,&numCol,&objSense,&objOffset,&A_rw,&rhs,&cost,&lb,&ub,
                         &integerColumn);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&integerColumn.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&ub.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&lb.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&cost.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&rhs.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&A_rw.super__Vector_base<double,_std::allocator<double>_>);
  return iVar4;
}

Assistant:

int writeMPS_dense_cpp(const char *filename, int* numRow_p, int* numCol_p, int* objSense_p, double* objOffset_p,
		     double ** A_rw_p,
		     double ** rhs_p, double ** cost_p, double ** lb_p, double ** ub_p,
		     int** integerColumn_p) {
  int numRow, numCol, objSense;
  double objOffset;
  vector<double> A_rw, rhs, cost, lb, ub;
  vector<int> integerColumn;
  numRow = (*numRow_p);
  numCol = (*numCol_p);
  objSense = (*objSense_p);
  objOffset = (*objOffset_p);
#ifdef JAJH_dev
  printf("writeMPS_dense_cpp: Model has %d rows and %d columns\n", numRow, numCol);
  printf("writeMPS_dense_cpp: Objective sense is %d; Objective offset is %g\n", objSense, objOffset);
#endif
  A_rw.resize(numRow*numCol);
  rhs.resize(numRow);
  cost.resize(numCol);
  lb.resize(numCol);
  ub.resize(numCol);
  integerColumn.resize(numCol);
  printf("writeMPS_dense_cpp: Allocated space\n");cout<<flush;
  for (int ix_n=0; ix_n<numRow*numCol; ix_n++) {
    A_rw[ix_n] = (*A_rw_p)[ix_n];
  }
  for (int r_n=0; r_n<numRow; r_n++) {
    rhs[r_n] = (*rhs_p)[r_n];
  }
  for (int c_n=0; c_n<numCol; c_n++) {
    cost[c_n] = (*cost_p)[c_n];
    lb[c_n] = (*lb_p)[c_n];
    ub[c_n] = (*ub_p)[c_n];
    integerColumn[c_n] = (*integerColumn_p)[c_n];
  }
  printf("writeMPS_dense_cpp: Copied A, RHS, costs and bounds\n");cout<<flush;
  int rtCd = writeMPS_dense(filename, numRow, numCol, objSense, objOffset,
			    A_rw,
			    rhs, cost, lb, ub,
			    integerColumn);
  return rtCd;
}